

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalCompare(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  runtime_error *prVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar7;
  Op op;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  element_type *local_c0;
  shared_ptr<minja::Expression> right;
  shared_ptr<minja::Expression> left;
  shared_ptr<minja::VariableExpr> identifier;
  undefined1 local_78 [16];
  Location location;
  string op_str;
  
  parseStringConcat((Parser *)&left);
  if (left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Expected left side of \'logical compare\' expression")
    ;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseLogicalCompare()::compare_tok_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parseLogicalCompare()::compare_tok_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseLogicalCompare()::compare_tok_abi_cxx11_,
               "==|!=|<=?|>=?|in\\b|is\\b|not\\s+in\\b",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::compare_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::compare_tok_abi_cxx11_);
  }
  if ((parseLogicalCompare()::not_tok_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parseLogicalCompare()::not_tok_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseLogicalCompare()::not_tok_abi_cxx11_,"not\\b",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseLogicalCompare()::not_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseLogicalCompare()::not_tok_abi_cxx11_);
  }
  op_str._M_dataplus._M_p = (pointer)&op_str.field_2;
  op_str._M_string_length = 0;
  op_str.field_2._M_local_buf[0] = '\0';
  local_c0 = (this->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c8 = (this->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  do {
    consumeToken((string *)&identifier,in_RSI,&parseLogicalCompare()::compare_tok_abi_cxx11_,Strip);
    lVar5 = std::__cxx11::string::operator=((string *)&op_str,(string *)&identifier);
    lVar5 = *(long *)(lVar5 + 8);
    std::__cxx11::string::~string((string *)&identifier);
    _Var1 = left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (lVar5 == 0) {
      left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var1._M_pi;
      left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_001a661f;
    }
    get_location(&location,in_RSI);
    bVar2 = std::operator==(&op_str,"is");
    if (bVar2) {
      consumeToken((string *)&identifier,in_RSI,&parseLogicalCompare()::not_tok_abi_cxx11_,Strip);
      _Var1 = identifier.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      std::__cxx11::string::~string((string *)&identifier);
      parseIdentifier((Parser *)&identifier);
      if (identifier.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = local_c8;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_c0;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Expected identifier after \'is\' keyword");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_78._0_4_ =
           0x13 - (uint)(_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      std::
      make_shared<minja::BinaryOpExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::VariableExpr>,minja::BinaryOpExpr::Op>
                ((Location *)&right,
                 (shared_ptr<minja::Expression> *)
                 &(left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  location,(shared_ptr<minja::VariableExpr> *)&left,(Op *)&identifier);
      local_c0 = (element_type *)
                 right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8 = right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
      right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&identifier.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      parseStringConcat((Parser *)&right);
      if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = local_c8;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_c0;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar6,"Expected right side of \'logical compare\' expression");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar3 = std::operator==(&op_str,"==");
      if ((((!bVar3) && (bVar3 = std::operator==(&op_str,"!="), !bVar3)) &&
          (bVar3 = std::operator==(&op_str,"<"), !bVar3)) &&
         (((bVar3 = std::operator==(&op_str,">"), !bVar3 &&
           (bVar3 = std::operator==(&op_str,"<="), !bVar3)) &&
          ((bVar3 = std::operator==(&op_str,">="), !bVar3 &&
           (bVar3 = std::operator==(&op_str,"in"), !bVar3)))))) {
        std::__cxx11::string::substr((ulong)&identifier,(ulong)&op_str);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&identifier,"not");
        std::__cxx11::string::~string((string *)&identifier);
        if (!bVar3) {
          (this->template_str).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = local_c8;
          (this->template_str).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_c0;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &identifier,"Unknown comparison operator: ",&op_str);
          std::runtime_error::runtime_error(prVar6,(string *)&identifier);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      get_location((Location *)&identifier,in_RSI);
      std::
      make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
                ((Location *)local_78,(shared_ptr<minja::Expression> *)&identifier,&left,
                 (Op *)&right);
      std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)&left,
                 (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&identifier.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while (!bVar2);
  (this->template_str).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_c8;
  (this->template_str).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_c0;
LAB_001a661f:
  std::__cxx11::string::~string((string *)&op_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&left.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseLogicalCompare() {
        auto left = parseStringConcat();
        if (!left) throw std::runtime_error("Expected left side of 'logical compare' expression");

        static std::regex compare_tok(R"(==|!=|<=?|>=?|in\b|is\b|not\s+in\b)");
        static std::regex not_tok(R"(not\b)");
        std::string op_str;
        while (!(op_str = consumeToken(compare_tok)).empty()) {
            auto location = get_location();
            if (op_str == "is") {
              auto negated = !consumeToken(not_tok).empty();

              auto identifier = parseIdentifier();
              if (!identifier) throw std::runtime_error("Expected identifier after 'is' keyword");

              return std::make_shared<BinaryOpExpr>(
                  left->location,
                  std::move(left), std::move(identifier),
                  negated ? BinaryOpExpr::Op::IsNot : BinaryOpExpr::Op::Is);
            }
            auto right = parseStringConcat();
            if (!right) throw std::runtime_error("Expected right side of 'logical compare' expression");
            BinaryOpExpr::Op op;
            if (op_str == "==") op = BinaryOpExpr::Op::Eq;
            else if (op_str == "!=") op = BinaryOpExpr::Op::Ne;
            else if (op_str == "<") op = BinaryOpExpr::Op::Lt;
            else if (op_str == ">") op = BinaryOpExpr::Op::Gt;
            else if (op_str == "<=") op = BinaryOpExpr::Op::Le;
            else if (op_str == ">=") op = BinaryOpExpr::Op::Ge;
            else if (op_str == "in") op = BinaryOpExpr::Op::In;
            else if (op_str.substr(0, 3) == "not") op = BinaryOpExpr::Op::NotIn;
            else throw std::runtime_error("Unknown comparison operator: " + op_str);
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }
        return left;
    }